

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLeft3(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *eps,
             number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec,int *idx,
             number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *rhs,int *ridx,int rn,
             number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *rhs2,int *ridx2,int rn2,
             number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec3,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *rhs3,int *ridx3,int rn3)

{
  int iVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RSI;
  int *in_RDI;
  int in_stack_00000008;
  int in_stack_00000130;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffca0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd50;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd60;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd68;
  undefined1 local_188 [92];
  uint in_stack_fffffffffffffed4;
  int *in_stack_fffffffffffffed8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffee0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffee8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffef0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  uint uVar3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff60;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff70;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff78;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  
  if (in_RDI[100] == 0) {
    in_stack_ffffffffffffff58 =
         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)&stack0xfffffffffffffee8;
    pnVar2 = in_RSI;
    in_stack_ffffffffffffff50 = in_RSI;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffca0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    uVar3 = (uint)((ulong)pnVar2 >> 0x20);
    in_stack_00000008 =
         solveUpdateLeft(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffff68,(int *)in_stack_ffffffffffffff60,
                         (fpclass_type)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    in_stack_ffffffffffffff68 =
         (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)(local_188 + 0x38);
    in_stack_ffffffffffffff60 = in_RSI;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffca0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    solveUleft(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_stack_ffffffffffffff68,(int *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58,(int *)in_stack_ffffffffffffff50,in_stack_00000130);
    this_00 = (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)local_188;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffca0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffc9c,in_stack_00000008));
    solveUpdateLeft(this_00,in_RSI,
                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)in_stack_ffffffffffffff68,(int *)in_stack_ffffffffffffff60,
                    (fpclass_type)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffca0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffc9c,in_stack_00000008));
    solveUleftNoNZ(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   in_stack_ffffffffffffff50,in_RDI,uVar3);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffca0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffc9c,in_stack_00000008));
    solveUpdateLeft(this_00,in_RSI,
                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)in_stack_ffffffffffffff68,(int *)in_stack_ffffffffffffff60,
                    (fpclass_type)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffca0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffc9c,in_stack_00000008));
    solveUleftNoNZ(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   in_stack_ffffffffffffff50,in_RDI,uVar3);
    uVar3 = (uint)((ulong)in_RDI >> 0x20);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffca0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    uVar3 = (uint)((ulong)in_RSI >> 0x20);
    solveUleft(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_stack_ffffffffffffff68,(int *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58,(int *)in_stack_ffffffffffffff50,in_stack_00000130);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffca0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffc9c,in_stack_00000008));
    solveLleftForest(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                     in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffca0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffc9c,in_stack_00000008));
    solveUleftNoNZ(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   in_stack_ffffffffffffff50,in_RDI,uVar3);
    solveLleftForestNoNZ(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffca0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffc9c,in_stack_00000008));
    solveUleftNoNZ(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   in_stack_ffffffffffffff50,in_RDI,uVar3);
    uVar3 = (uint)((ulong)in_RDI >> 0x20);
    solveLleftForestNoNZ(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffca0,
             (cpp_dec_float<50U,_int,_void> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_00000008))
  ;
  iVar1 = solveLleft(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                     (int *)in_stack_ffffffffffffff50,uVar3);
  solveLleftNoNZ(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  solveLleftNoNZ(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  return iVar1;
}

Assistant:

int CLUFactor<R>::vSolveLeft3(R eps,
                              R* vec, int* idx,                      /* result */
                              R* rhs, int* ridx, int rn,             /* rhs    */
                              R* vec2,                               /* result2 */
                              R* rhs2, int* ridx2, int rn2,          /* rhs2    */
                              R* vec3,                               /* result3 */
                              R* rhs3, int* ridx3, int rn3)          /* rhs3    */
{

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = solveUpdateLeft(eps, rhs, ridx, rn);
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn2 = solveUpdateLeft(eps, rhs2, ridx2, rn2);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
      rn3 = solveUpdateLeft(eps, rhs3, ridx3, rn3);
      solveUleftNoNZ(eps, vec3, rhs3, ridx3, rn3);
   }
   else
   {
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn = solveLleftForest(eps, vec, idx, rn);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
      solveLleftForestNoNZ(vec2);
      solveUleftNoNZ(eps, vec3, rhs3, ridx3, rn3);
      solveLleftForestNoNZ(vec3);
   }

   rn = solveLleft(eps, vec, idx, rn);

   solveLleftNoNZ(vec2);
   solveLleftNoNZ(vec3);

   return rn;
}